

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependDouble
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,double value)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar2;
  TrackAllocData local_58;
  BufferBuilder *local_30;
  BufferBuilderDouble *entry;
  double value_local;
  LPCWSTR clue_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  entry = (BufferBuilderDouble *)value;
  value_local = (double)clue;
  clue_local = (LPCWSTR)builder;
  builder_local = (BufferBuilderList *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&ConstantSizedBufferBuilderOf<double>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x324);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_58);
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar1,0x3f67b0);
  ConstantSizedBufferBuilderOf<double>::ConstantSizedBufferBuilderOf
            ((ConstantSizedBufferBuilderOf<double> *)value_00,(LPCWSTR)value_local,(double *)&entry)
  ;
  local_30 = value_00;
  pIVar2 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                     (*(ImmutableList<Js::BufferBuilder_*> **)(clue_local + 0xc),value_00,
                      this->alloc);
  *(ImmutableList<Js::BufferBuilder_*> **)(clue_local + 0xc) = pIVar2;
  return 8;
}

Assistant:

uint32 PrependDouble(BufferBuilderList & builder, LPCWSTR clue, double value)
    {
        auto entry = Anew(alloc, BufferBuilderDouble, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        return sizeof(double);
    }